

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O0

void GetSumAbsDiff32_SSE2(__m128i *A,__m128i *B,__m128i *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __m128i alVar5;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 local_98;
  undefined4 uStack_94;
  __m128i s_hi;
  __m128i s_lo;
  __m128i B_hi;
  __m128i A_hi;
  __m128i B_lo;
  __m128i A_lo;
  __m128i *out_local;
  __m128i *B_local;
  __m128i *A_local;
  
  local_98 = (undefined4)(*A)[0];
  uStack_94 = (undefined4)((ulong)(*A)[0] >> 0x20);
  local_b8 = (undefined4)(*B)[0];
  uStack_b4 = (undefined4)((ulong)(*B)[0] >> 0x20);
  local_c8 = (undefined4)(*A)[0];
  uStack_c4 = (undefined4)((ulong)(*A)[0] >> 0x20);
  A_hi[0]._0_4_ = (undefined4)(*A)[1];
  A_hi[0]._4_4_ = (undefined4)((ulong)(*A)[1] >> 0x20);
  s_lo[0]._0_4_ = (undefined4)(*B)[1];
  s_lo[0]._4_4_ = (undefined4)((ulong)(*B)[1] >> 0x20);
  s_hi[0]._0_4_ = (undefined4)(*A)[1];
  s_hi[0]._4_4_ = (undefined4)((ulong)(*A)[1] >> 0x20);
  auVar2._4_4_ = local_98;
  auVar2._0_4_ = local_98;
  auVar2._12_4_ = uStack_94;
  auVar2._8_4_ = uStack_94;
  auVar3._4_4_ = local_c8;
  auVar3._0_4_ = local_b8;
  auVar3._12_4_ = uStack_c4;
  auVar3._8_4_ = uStack_b4;
  auVar3 = psadbw(auVar2,auVar3);
  auVar1._4_4_ = (undefined4)A_hi[0];
  auVar1._0_4_ = (undefined4)A_hi[0];
  auVar1._12_4_ = A_hi[0]._4_4_;
  auVar1._8_4_ = A_hi[0]._4_4_;
  auVar4._4_4_ = (undefined4)s_hi[0];
  auVar4._0_4_ = (undefined4)s_lo[0];
  auVar4._12_4_ = s_hi[0]._4_4_;
  auVar4._8_4_ = s_lo[0]._4_4_;
  auVar4 = psadbw(auVar1,auVar4);
  alVar5 = (__m128i)packssdw(auVar3,auVar4);
  *out = alVar5;
  return;
}

Assistant:

static void GetSumAbsDiff32_SSE2(const __m128i* const A, const __m128i* const B,
                                 __m128i* const out) {
  // We can unpack with any value on the upper 32 bits, provided it's the same
  // on both operands (to that their sum of abs diff is zero). Here we use *A.
  const __m128i A_lo = _mm_unpacklo_epi32(*A, *A);
  const __m128i B_lo = _mm_unpacklo_epi32(*B, *A);
  const __m128i A_hi = _mm_unpackhi_epi32(*A, *A);
  const __m128i B_hi = _mm_unpackhi_epi32(*B, *A);
  const __m128i s_lo = _mm_sad_epu8(A_lo, B_lo);
  const __m128i s_hi = _mm_sad_epu8(A_hi, B_hi);
  *out = _mm_packs_epi32(s_lo, s_hi);
}